

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

ptr<Statement> __thiscall Parser::localDecl(Parser *this,TokenType tokenType)

{
  int in_EDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined4 in_register_00000034;
  Parser *this_00;
  ptr<Statement> pVar1;
  undefined1 local_a8 [24];
  ptr<Expression> expr;
  Token local_78;
  string local_40 [8];
  Identifier identifier;
  bool constant;
  TokenType tokenType_local;
  Parser *this_local;
  
  this_00 = (Parser *)CONCAT44(in_register_00000034,tokenType);
  identifier.field_2._M_local_buf[0xb] = in_EDX == 0x2b;
  consume(this_00);
  token(&local_78,this_00);
  std::__cxx11::string::string(local_40,(string *)&local_78.lexeme);
  Token::~Token(&local_78);
  consume(this_00,Identifier,"identifier");
  consume(this_00,Assign,"assignment operator \'=\'");
  expression((Parser *)(local_a8 + 0x10));
  consume(this_00,StatEnd,"\';\'");
  make<LocalDeclarationStatement,std::__cxx11::string&,bool&,std::shared_ptr<Expression>&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8,
             (bool *)local_40,(shared_ptr<Expression> *)((long)&identifier.field_2 + 0xb));
  std::shared_ptr<Statement>::shared_ptr<LocalDeclarationStatement,void>
            ((shared_ptr<Statement> *)this,(shared_ptr<LocalDeclarationStatement> *)local_a8);
  std::shared_ptr<LocalDeclarationStatement>::~shared_ptr
            ((shared_ptr<LocalDeclarationStatement> *)local_a8);
  std::shared_ptr<Expression>::~shared_ptr((shared_ptr<Expression> *)(local_a8 + 0x10));
  std::__cxx11::string::~string(local_40);
  pVar1.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  pVar1.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ptr<Statement>)pVar1.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<Statement> Parser::localDecl(TokenType tokenType) {
    bool constant = tokenType == TokenType::Const;
    consume();
    Identifier identifier = token().lexeme;
    consume(TokenType::Identifier, "identifier");
    consume(TokenType::Assign, "assignment operator '='");
    ptr<Expression> expr = expression();
    consume(TokenType::StatEnd, "';'");
    return make<LocalDeclarationStatement>(identifier, constant, expr);
}